

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

_Bool mi_heap_check_owned(mi_heap_t *heap,void *p)

{
  bool bVar1;
  size_t i;
  long lVar2;
  mi_page_t *pmVar3;
  
  if (((heap == (mi_heap_t *)0x0) || (((ulong)p & 7) != 0 || heap == &_mi_heap_empty)) ||
     (heap->page_count == 0)) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    lVar2 = 0;
    do {
      for (pmVar3 = heap->pages[lVar2].first; pmVar3 != (mi_page_t *)0x0; pmVar3 = pmVar3->next) {
        bVar1 = p < pmVar3->page_start + (ulong)pmVar3->capacity * pmVar3->block_size &&
                pmVar3->page_start <= p;
        if (bVar1) {
          return bVar1;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x4b);
  }
  return bVar1;
}

Assistant:

bool mi_heap_check_owned(mi_heap_t* heap, const void* p) {
  mi_assert(heap != NULL);
  if (heap==NULL || !mi_heap_is_initialized(heap)) return false;
  if (((uintptr_t)p & (MI_INTPTR_SIZE - 1)) != 0) return false;  // only aligned pointers
  bool found = false;
  mi_heap_visit_pages(heap, &mi_heap_page_check_owned, (void*)p, &found);
  return found;
}